

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listInput.cpp
# Opt level: O2

void __thiscall listInput::drawHighlight(listInput *this)

{
  WINDOW *pWVar1;
  int iVar2;
  int iVar3;
  string local_40;
  
  pWVar1 = this->numWin;
  if (pWVar1 == (WINDOW *)0x0) {
    iVar2 = 0;
    iVar3 = -1;
  }
  else {
    iVar3 = (int)pWVar1->_begy;
    iVar2 = pWVar1->_begx + 1;
  }
  if (this->highlight != (WINDOW *)0x0) {
    werase();
    delwin(this->highlight);
  }
  pWVar1 = (WINDOW *)newwin(1,4,iVar3 + this->current,iVar2);
  this->highlight = pWVar1;
  wbkgd(this->numWin,0x500);
  wbkgd(this->highlight,0x100);
  pWVar1 = this->highlight;
  makeThreeDigit_abi_cxx11_
            (&local_40,
             (this->numStorage).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)this->current + 1]);
  wprintw(pWVar1,"%s",local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  wrefresh(this->highlight);
  return;
}

Assistant:

void listInput::drawHighlight() {
  int y,x;
  getbegyx(numWin, y, x);
  if(highlight){
    werase(highlight);
    delwin(highlight);
  }
  highlight = newwin(1, INPUT_LIST_WIDTH,y + current, x + 1);
  wbkgd(numWin, COLOR_PAIR(5));
  wbkgd(highlight, COLOR_PAIR(1));
  wprintw(highlight, "%s", makeThreeDigit(numStorage[current+1]).c_str());
  wrefresh(highlight);
}